

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::PointLight>::transform
          (LightNodeImpl<embree::SceneGraph::PointLight> *this,AffineSpace3fa *space)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  _func_int *p_Var20;
  _func_int *p_Var21;
  _func_int **pp_Var22;
  float *in_RDX;
  
  pp_Var22 = (_func_int **)alignedMalloc(0xa0,0x10);
  fVar1 = space[2].l.vx.field_0.m128[0];
  fVar2 = space[2].l.vx.field_0.m128[1];
  fVar3 = space[2].l.vx.field_0.m128[2];
  fVar4 = in_RDX[8];
  fVar5 = in_RDX[9];
  fVar6 = in_RDX[10];
  fVar7 = in_RDX[0xb];
  fVar8 = in_RDX[0xc];
  fVar9 = in_RDX[0xd];
  fVar10 = in_RDX[0xe];
  fVar11 = in_RDX[0xf];
  fVar12 = in_RDX[4];
  fVar13 = in_RDX[5];
  fVar14 = in_RDX[6];
  fVar15 = in_RDX[7];
  fVar16 = *in_RDX;
  fVar17 = in_RDX[1];
  fVar18 = in_RDX[2];
  fVar19 = in_RDX[3];
  p_Var20 = *(_func_int **)&space[2].l.vy.field_0;
  p_Var21 = *(_func_int **)((long)&space[2].l.vy.field_0 + 8);
  pp_Var22[1] = (_func_int *)0x0;
  pp_Var22[2] = (_func_int *)(pp_Var22 + 4);
  pp_Var22[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var22 + 4) = 0;
  pp_Var22[6] = (_func_int *)(pp_Var22 + 8);
  pp_Var22[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var22 + 8) = 0;
  pp_Var22[10] = (_func_int *)0x0;
  *(undefined2 *)(pp_Var22 + 0xb) = 0;
  *(undefined4 *)((long)pp_Var22 + 0x5c) = 0xffffffff;
  pp_Var22[0xc] = (_func_int *)0x0;
  *pp_Var22 = (_func_int *)&PTR__Node_002c5948;
  *(undefined4 *)(pp_Var22 + 0xe) = 1;
  *(float *)(pp_Var22 + 0x10) = fVar1 * fVar16 + fVar2 * fVar12 + fVar3 * fVar4 + fVar8;
  *(float *)((long)pp_Var22 + 0x84) = fVar1 * fVar17 + fVar2 * fVar13 + fVar3 * fVar5 + fVar9;
  *(float *)(pp_Var22 + 0x11) = fVar1 * fVar18 + fVar2 * fVar14 + fVar3 * fVar6 + fVar10;
  *(float *)((long)pp_Var22 + 0x8c) = fVar1 * fVar19 + fVar2 * fVar15 + fVar3 * fVar7 + fVar11;
  pp_Var22[0x12] = p_Var20;
  pp_Var22[0x13] = p_Var21;
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var22;
  LOCK();
  pp_Var22[1] = pp_Var22[1] + 1;
  UNLOCK();
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> transform(const AffineSpace3fa& space) const {
        return new LightNodeImpl(light.transform(space));
      }